

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_write_float_to_float64(void *p_src_data,void *p_dest_data,OPJ_UINT32 p_nb_elem)

{
  uint in_EDX;
  OPJ_BYTE *in_RSI;
  float *in_RDI;
  OPJ_FLOAT64 l_temp;
  OPJ_UINT32 i;
  OPJ_FLOAT32 *l_src_data;
  OPJ_BYTE *l_dest_data;
  uint local_2c;
  float *local_28;
  OPJ_BYTE *local_20;
  
  local_28 = in_RDI;
  local_20 = in_RSI;
  for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
    opj_write_double_LE(local_20,(OPJ_FLOAT64)(double)*local_28);
    local_20 = local_20 + 8;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void  j2k_write_float_to_float64 (const void * p_src_data, void * p_dest_data, OPJ_UINT32 p_nb_elem)
{
	OPJ_BYTE * l_dest_data = (OPJ_BYTE *) p_dest_data;
	OPJ_FLOAT32 * l_src_data = (OPJ_FLOAT32 *) p_src_data;
	OPJ_UINT32 i;
	OPJ_FLOAT64 l_temp;

	for (i=0;i<p_nb_elem;++i) {
		l_temp = (OPJ_FLOAT64) *(l_src_data++);

		opj_write_double(l_dest_data,l_temp);

		l_dest_data+=sizeof(OPJ_FLOAT64);
	}
}